

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

void __thiscall
testing::internal::ReturnAction<std::nullopt_t>::
Impl<std::nullopt_t,_std::optional<solitaire::cards::Card>_()>::Impl
          (Impl<std::nullopt_t,_std::optional<solitaire::cards::Card>_()> *this,
          shared_ptr<std::nullopt_t> *value)

{
  undefined8 extraout_RDX;
  optional<solitaire::cards::Card> oVar1;
  undefined4 local_50;
  _Storage<solitaire::cards::Card,_true> local_24;
  uint local_1c;
  __shared_ptr_access<std::nullopt_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_18;
  shared_ptr<std::nullopt_t> *value_local;
  Impl<std::nullopt_t,_std::optional<solitaire::cards::Card>_()> *this_local;
  
  local_18 = (__shared_ptr_access<std::nullopt_t,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)value;
  value_local = (shared_ptr<std::nullopt_t> *)this;
  ActionInterface<std::optional<solitaire::cards::Card>_()>::ActionInterface
            (&this->super_ActionInterface<std::optional<solitaire::cards::Card>_()>);
  (this->super_ActionInterface<std::optional<solitaire::cards::Card>_()>)._vptr_ActionInterface =
       (_func_int **)&PTR__Impl_004fbb18;
  std::__shared_ptr_access<std::nullopt_t,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            (local_18);
  std::optional<solitaire::cards::Card>::optional((optional<solitaire::cards::Card> *)&local_24);
  oVar1.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload._M_value.suit = 0;
  oVar1.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload._M_value.value = local_1c;
  oVar1.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._8_4_ = (undefined4)extraout_RDX;
  oVar1 = ImplicitCast_<std::optional<solitaire::cards::Card>>((internal *)local_24,oVar1);
  local_50 = CONCAT31(local_50._1_3_,
                      oVar1.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
                      super__Optional_payload_base<solitaire::cards::Card>._M_engaged);
  (this->value_).super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
  super__Optional_payload_base<solitaire::cards::Card>._M_payload =
       oVar1.super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
       super__Optional_payload_base<solitaire::cards::Card>._M_payload;
  *(undefined4 *)
   &(this->value_).super__Optional_base<solitaire::cards::Card,_true,_true>._M_payload.
    super__Optional_payload_base<solitaire::cards::Card>._M_engaged = local_50;
  return;
}

Assistant:

explicit Impl(const std::shared_ptr<R>& value)
        : value_before_cast_(*value),
          value_(ImplicitCast_<Result>(value_before_cast_)) {}